

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<unsigned_char>::collect_borders
          (CharClass<unsigned_char> *this,
          set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *dest)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<unsigned_char>,_bool> pVar2;
  uchar local_51;
  _Base_ptr local_50;
  undefined1 local_48;
  uchar local_39;
  reference local_38;
  Range<unsigned_char> *r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *__range2;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *dest_local;
  CharClass<unsigned_char> *this_local;
  
  __end0 = std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::begin(&this->m_ranges);
  r = (Range<unsigned_char> *)
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      end(&this->m_ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                *)&r);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator*(&__end0);
    local_39 = Range<unsigned_char>::start(local_38);
    pVar2 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
            insert(dest,&local_39);
    local_50 = (_Base_ptr)pVar2.first._M_node;
    local_48 = pVar2.second;
    local_51 = Range<unsigned_char>::end(local_38);
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::insert
              (dest,&local_51);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void collect_borders(std::set<TCHAR>& dest) const
    {
        for (const auto& r : m_ranges)
        {
            dest.insert(r.start());
            dest.insert(r.end());
        }
    }